

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O3

uint __thiscall
llvm::SourceMgr::AddIncludeFile
          (SourceMgr *this,string *Filename,SMLoc IncludeLoc,string *IncludedFile)

{
  Twine *pTVar1;
  pointer pbVar2;
  long lVar3;
  SourceMgr *pSVar4;
  undefined8 uVar5;
  long *plVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  NewBufOrErr;
  Child local_a0;
  long local_98;
  char *local_90;
  long lStack_88;
  SourceMgr *local_80;
  anon_union_16_2_427f0595_for_ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>_2
  local_78;
  byte local_68;
  char *local_60;
  string *local_58;
  Child local_50 [2];
  Child local_40 [2];
  
  local_60 = IncludeLoc.Ptr;
  local_58 = Filename;
  std::__cxx11::string::_M_assign((string *)IncludedFile);
  Twine::Twine((Twine *)&local_a0,IncludedFile);
  MemoryBuffer::getFile
            ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_78.TStorage,(Twine *)&local_a0,-1,true,false);
  uVar7 = (ulong)((long)(this->IncludeDirectories).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->IncludeDirectories).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  local_80 = this;
  if (((int)uVar7 != 0 & local_68) == 1) {
    uVar7 = uVar7 & 0xffffffff;
    lVar9 = 8;
    do {
      uVar7 = uVar7 - 1;
      pbVar2 = (local_80->IncludeDirectories).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sys::path::get_separator(native);
      local_50[0].twine = (Twine *)local_40;
      lVar3 = *(long *)((long)pbVar2 + lVar9 + -8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,lVar3,
                 *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar9) + lVar3);
      std::__cxx11::string::append(&local_50[0].character);
      plVar6 = (long *)std::__cxx11::string::_M_append
                                 (&local_50[0].character,(ulong)(local_58->_M_dataplus)._M_p);
      pTVar1 = (Twine *)(plVar6 + 2);
      if (((unsigned_long *)*plVar6).twine == pTVar1) {
        local_90 = (pTVar1->LHS).cString;
        lStack_88 = plVar6[3];
        local_a0.twine = (Twine *)&local_90;
      }
      else {
        local_90 = (pTVar1->LHS).cString;
        local_a0.decUL = ((unsigned_long *)*plVar6).decUL;
      }
      local_98 = plVar6[1];
      *plVar6 = (long)pTVar1;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)IncludedFile,(string *)&local_a0.character);
      if (local_a0.twine != (Twine *)&local_90) {
        operator_delete(local_a0.twine,(ulong)(local_90 + 1));
      }
      if (&(local_50[0].twine)->LHS != local_40) {
        operator_delete(local_50[0].twine,(ulong)((long)&(local_40[0].twine)->LHS + 1));
      }
      Twine::Twine((Twine *)local_50,IncludedFile);
      MemoryBuffer::getFile
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                  *)&local_a0,(Twine *)local_50,-1,true,false);
      ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
      moveAssign<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  *)&local_78.TStorage,
                 (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                  *)&local_a0);
      if ((((ulong)local_90 & 1) == 0) && (local_a0.twine != (Twine *)0x0)) {
        (**(code **)((char *)*local_a0.decUL + 8))();
      }
    } while ((uVar7 != 0) && (lVar9 = lVar9 + 0x20, (local_68 & 1) != 0));
  }
  uVar5 = local_78.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer;
  pSVar4 = local_80;
  uVar8 = 0;
  if ((local_68 & 1) == 0) {
    local_78.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer =
         (AlignedCharArrayUnion<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>,_char,_char,_char,_char,_char,_char,_char,_char,_char>
          )(AlignedCharArray<8UL,_8UL>)0x0;
    local_98 = 0;
    local_a0.decUL = (unsigned_long *)uVar5;
    local_90 = local_60;
    std::vector<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>::
    emplace_back<llvm::SourceMgr::SrcBuffer>(&local_80->Buffers,(SrcBuffer *)&local_a0);
    uVar8 = (int)((ulong)((long)(pSVar4->Buffers).
                                super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pSVar4->Buffers).
                               super__Vector_base<llvm::SourceMgr::SrcBuffer,_std::allocator<llvm::SourceMgr::SrcBuffer>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
    SrcBuffer::~SrcBuffer((SrcBuffer *)&local_a0);
  }
  if (((local_68 & 1) == 0) &&
     (local_78.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer != (AlignedCharArray<8UL,_8UL>)0x0))
  {
    (**(code **)(*(char **)local_78.TStorage.super_AlignedCharArray<8UL,_8UL>.buffer + 8))();
  }
  return uVar8;
}

Assistant:

unsigned SourceMgr::AddIncludeFile(const std::string &Filename,
                                   SMLoc IncludeLoc,
                                   std::string &IncludedFile) {
  IncludedFile = Filename;
  ErrorOr<std::unique_ptr<MemoryBuffer>> NewBufOrErr =
    MemoryBuffer::getFile(IncludedFile);

  // If the file didn't exist directly, see if it's in an include path.
  for (unsigned i = 0, e = IncludeDirectories.size(); i != e && !NewBufOrErr;
       ++i) {
    IncludedFile =
        IncludeDirectories[i] + sys::path::get_separator().data() + Filename;
    NewBufOrErr = MemoryBuffer::getFile(IncludedFile);
  }

  if (!NewBufOrErr)
    return 0;

  return AddNewSourceBuffer(std::move(*NewBufOrErr), IncludeLoc);
}